

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O2

uint32_t phf_g<std::__cxx11::string>
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k,
                   uint32_t seed)

{
  uint32_t uVar1;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,(string *)k);
  uVar1 = phf_round32(&local_38,seed);
  std::__cxx11::string::~string((string *)&local_38);
  uVar1 = phf_mix32(uVar1);
  return uVar1;
}

Assistant:

static inline uint32_t phf_g(T k, uint32_t seed) {
	uint32_t h1 = seed;

	h1 = phf_round32(k, h1);

	return phf_mix32(h1);
}